

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void popad_(PDISASM pMyDisasm)

{
  char *pcVar1;
  int iVar2;
  Int32 IVar3;
  
  if ((pMyDisasm->Reserved_).Architecture != 0x40) {
    pcVar1 = (pMyDisasm->Instruction).Mnemonic;
    iVar2 = (pMyDisasm->Reserved_).OperandSize;
    (pMyDisasm->Instruction).Category = 0x10001;
    if (iVar2 == 0x20) {
      builtin_strncpy(pcVar1,"popad",6);
      (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
      (pMyDisasm->Operand1).OpType = 0x20000;
      (pMyDisasm->Operand1).Registers.type = 1;
      (pMyDisasm->Operand1).Registers.gpr = 0xff;
      IVar3 = 0x20;
    }
    else {
      builtin_strncpy(pcVar1,"popa",5);
      (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
      (pMyDisasm->Operand1).OpType = 0x20000;
      (pMyDisasm->Operand1).Registers.type = 1;
      (pMyDisasm->Operand1).Registers.gpr = 0xff;
      IVar3 = 0x10;
    }
    (pMyDisasm->Operand1).OpSize = IVar3;
    (pMyDisasm->Operand2).OpType = 0x30000;
    (pMyDisasm->Operand2).OpSize = IVar3;
    (pMyDisasm->Operand2).Memory.BaseRegister = 0x10;
    (pMyDisasm->Instruction).ImplicitModifiedRegs.type = 1;
    (pMyDisasm->Instruction).ImplicitModifiedRegs.gpr = 0x10;
    return;
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
  (pMyDisasm->Operand1).AccessMode = 0;
  (pMyDisasm->Operand2).AccessMode = 0;
  (pMyDisasm->Operand3).AccessMode = 0;
  (pMyDisasm->Operand4).AccessMode = 0;
  (pMyDisasm->Operand5).AccessMode = 0;
  (pMyDisasm->Operand6).AccessMode = 0;
  (pMyDisasm->Operand7).AccessMode = 0;
  (pMyDisasm->Operand8).AccessMode = 0;
  (pMyDisasm->Operand9).AccessMode = 0;
  (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  return;
}

Assistant:

void __bea_callspec__ popad_(PDISASM pMyDisasm)
{

    if (GV.Architecture == 64) {
        failDecode(pMyDisasm);
    }
    else if (GV.OperandSize == 32) {
      pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+DATA_TRANSFER;

        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "popad");
        #endif
        GV.EIP_++;
        pMyDisasm->Operand1.OpType = REGISTER_TYPE;
        pMyDisasm->Operand1.Registers.type = GENERAL_REG;
        pMyDisasm->Operand1.Registers.gpr = REG0+REG1+REG2+REG3+REG4+REG5+REG6+REG7;
        pMyDisasm->Operand1.OpSize = 32;
        pMyDisasm->Operand2.OpType = MEMORY_TYPE;
        pMyDisasm->Operand2.OpSize = 32;
        pMyDisasm->Operand2.Memory.BaseRegister = REG4;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG4;
    }
    else {
      pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+DATA_TRANSFER;

        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "popa");
        #endif
        GV.EIP_++;
        pMyDisasm->Operand1.OpType = REGISTER_TYPE;
        pMyDisasm->Operand1.Registers.type = GENERAL_REG;
        pMyDisasm->Operand1.Registers.gpr = REG0+REG1+REG2+REG3+REG4+REG5+REG6+REG7;
        pMyDisasm->Operand1.OpSize = 16;
        pMyDisasm->Operand2.OpType = MEMORY_TYPE;
        pMyDisasm->Operand2.OpSize = 16;
        pMyDisasm->Operand2.Memory.BaseRegister = REG4;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG4;
    }
}